

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

int runsiz(runsdef *item)

{
  byte bVar1;
  
  bVar1 = item->runstyp;
  if (bVar1 < 0xe) {
    if ((0x2404U >> (bVar1 & 0x1f) & 1) != 0) {
      return 2;
    }
    if ((0x88U >> (bVar1 & 0x1f) & 1) != 0) {
      return (int)*(ushort *)(item->runsv).runsvstr;
    }
    if (bVar1 == 1) {
      return 4;
    }
  }
  return 0;
}

Assistant:

int runsiz(runsdef *item)
{
    switch(item->runstyp)
    {
    case DAT_NUMBER:
        return(4);
    case DAT_SSTRING:
    case DAT_LIST:
        return(osrp2(item->runsv.runsvstr));
    case DAT_PROPNUM:
    case DAT_OBJECT:
    case DAT_FNADDR:
        return(2);
    default:
        return(0);
    }
}